

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  byte in_DL;
  Mat *in_RSI;
  Mat *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar3;
  int j_7;
  int i_13;
  float *outptr_1;
  float *ptr_10;
  int q_8;
  int i_12;
  float *ptr_9;
  int q_7;
  int j_6;
  float *mins_ptr_3;
  int q_6;
  int j_5;
  int i_11;
  float *mins_ptr_2;
  float *ptr_8;
  int q_5;
  Mat mins_1;
  int i_10;
  float *mins_ptr_1;
  int q_4;
  int j_4;
  float sum_8;
  int i_9;
  float *mins_ptr;
  float *ptr_7;
  int q_3;
  Mat mins;
  int j_3;
  float sum_7;
  int i_8;
  float *outptr;
  float *ptr_6;
  int q_2;
  int i_7;
  float sum_6;
  float *ptr_5;
  int q_1;
  int i_6;
  float sum_4;
  int i_5;
  float sum_5;
  float *ptr_4;
  int q;
  Mat sums_1;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_4;
  int j_1;
  float sum_3;
  float *ptr_2;
  int i_3;
  int i_2;
  float sum_1;
  int j;
  float sum_2;
  float *ptr_1;
  int i_1;
  Mat sums;
  int h;
  int w_1;
  int i;
  float sum;
  float *ptr;
  int w;
  int dims;
  size_t elemsize;
  reduction_op_max<float> op2;
  reduction_op_max<float> op;
  Allocator *in_stack_fffffffffffff9b8;
  Mat *in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c8;
  float in_stack_fffffffffffff9cc;
  Mat *in_stack_fffffffffffff9d0;
  int in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  Mat *in_stack_fffffffffffff9e0;
  int local_578;
  int local_574;
  Mat local_568;
  Mat *local_528;
  int local_520;
  int local_51c;
  Mat local_518;
  float *local_4d8;
  int local_4d0;
  int local_4cc;
  Mat local_4c8;
  float *local_488;
  int local_47c;
  int local_478;
  int local_474;
  Mat local_470;
  float *local_430;
  Mat local_428;
  float *local_3e8;
  int local_3dc;
  int local_394;
  Mat local_390;
  float *local_350;
  int local_348;
  int local_344;
  float local_340;
  int local_33c;
  Mat local_338;
  float *local_2f8;
  Mat local_2f0;
  float *local_2b0;
  int local_2a4;
  int local_25c;
  float local_258;
  int local_254;
  float *local_250;
  Mat local_248;
  float *local_208;
  int local_1fc;
  int local_1f8;
  float local_1f4;
  Mat local_1f0;
  float *local_1b0;
  int local_1a4;
  int local_1a0;
  float local_19c;
  int local_198;
  float local_194;
  Mat local_190;
  float *local_150;
  int local_144;
  Mat local_140;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  float *local_e8;
  int local_dc;
  int local_d8;
  float local_d4;
  float *local_d0;
  int local_c8;
  int local_c4;
  float local_c0;
  int local_b0;
  float local_ac;
  float *local_a8;
  int local_a0;
  undefined4 local_9c;
  Mat local_98;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_1d = in_DL & 1;
  local_1e = in_CL & 1;
  local_1f = in_R8B & 1;
  local_38 = in_RDI->elemsize;
  local_3c = in_RDI->dims;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_3c == 1) {
    local_40 = in_RDI->w;
    Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                (size_t)in_stack_fffffffffffff9d0,
                (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_48 = Mat::operator_cast_to_float_(local_10);
    local_4c = local_1c;
    for (local_50 = 0; fVar3 = local_4c, local_50 < local_40; local_50 = local_50 + 1) {
      local_4c = reduction_op_max<float>::operator()
                           ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                            (float *)in_stack_fffffffffffff9b8,(float *)0x167872);
    }
    pfVar2 = Mat::operator[](local_18,0);
    *pfVar2 = fVar3;
    return 0;
  }
  if (local_3c == 2) {
    local_54 = in_RDI->w;
    local_58 = in_RDI->h;
    if ((local_1d != 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::Mat(in_stack_fffffffffffff9d0,(int)in_stack_fffffffffffff9cc,
               (size_t)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_a0 = 0; local_a0 < local_58; local_a0 = local_a0 + 1) {
          local_a8 = Mat::row(local_10,local_a0);
          local_ac = local_1c;
          for (local_b0 = 0; fVar3 = local_ac, local_b0 < local_54; local_b0 = local_b0 + 1) {
            local_ac = reduction_op_max<float>::operator()
                                 ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                  (float *)in_stack_fffffffffffff9b8,(float *)0x167a29);
          }
          pfVar2 = Mat::operator[](&local_98,(long)local_a0);
          *pfVar2 = fVar3;
        }
        local_c0 = local_1c;
        for (local_c4 = 0; fVar3 = local_c0, local_c4 < local_58; local_c4 = local_c4 + 1) {
          Mat::operator[](&local_98,(long)local_c4);
          local_c0 = reduction_op_max<float>::operator()
                               ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                (float *)in_stack_fffffffffffff9b8,(float *)0x167b23);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x167ba6);
      return local_4;
    }
    if ((local_1d != 0) && (local_1e == 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      for (local_c8 = 0; local_c8 < local_58; local_c8 = local_c8 + 1) {
        local_d0 = Mat::row(local_10,local_c8);
        local_d4 = local_1c;
        for (local_d8 = 0; fVar3 = local_d4, local_d8 < local_54; local_d8 = local_d8 + 1) {
          local_d4 = reduction_op_max<float>::operator()
                               ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                (float *)in_stack_fffffffffffff9b8,(float *)0x167c83);
        }
        pfVar2 = Mat::operator[](local_18,(long)local_c8);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if ((local_1d == 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
      for (local_dc = 0; local_dc < local_58; local_dc = local_dc + 1) {
        local_e8 = Mat::row(local_10,local_dc);
        for (local_ec = 0; local_ec < local_54; local_ec = local_ec + 1) {
          Mat::operator[](local_18,(long)local_ec);
          fVar3 = reduction_op_max<float>::operator()
                            ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                             (float *)in_stack_fffffffffffff9b8,(float *)0x167de5);
          pfVar2 = Mat::operator[](local_18,(long)local_ec);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
  }
  if (local_3c == 3) {
    local_f0 = in_RDI->w;
    local_f4 = in_RDI->h;
    local_f8 = in_RDI->c;
    local_fc = local_f0 * local_f4;
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::Mat(in_stack_fffffffffffff9d0,(int)in_stack_fffffffffffff9cc,
               (size_t)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_144 = 0; local_144 < local_f8; local_144 = local_144 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_190);
          Mat::~Mat((Mat *)0x167faf);
          local_194 = local_1c;
          local_150 = pfVar2;
          for (local_198 = 0; fVar3 = local_194, local_198 < local_fc; local_198 = local_198 + 1) {
            local_194 = reduction_op_max<float>::operator()
                                  ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                   (float *)in_stack_fffffffffffff9b8,(float *)0x168015);
          }
          pfVar2 = Mat::operator[](&local_140,(long)local_144);
          *pfVar2 = fVar3;
        }
        local_19c = local_1c;
        for (local_1a0 = 0; fVar3 = local_19c, local_1a0 < local_f8; local_1a0 = local_1a0 + 1) {
          Mat::operator[](&local_140,(long)local_1a0);
          local_19c = reduction_op_max<float>::operator()
                                ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                 (float *)in_stack_fffffffffffff9b8,(float *)0x16810f);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x168192);
      return local_4;
    }
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      for (local_1a4 = 0; local_1a4 < local_f8; local_1a4 = local_1a4 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1f0);
        Mat::~Mat((Mat *)0x168246);
        local_1f4 = local_1c;
        local_1b0 = pfVar2;
        for (local_1f8 = 0; fVar3 = local_1f4, local_1f8 < local_fc; local_1f8 = local_1f8 + 1) {
          local_1f4 = reduction_op_max<float>::operator()
                                ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                 (float *)in_stack_fffffffffffff9b8,(float *)0x1682af);
        }
        pfVar2 = Mat::operator[](local_18,(long)local_1a4);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      for (local_1fc = 0; local_1fc < local_f8; local_1fc = local_1fc + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_248);
        Mat::~Mat((Mat *)0x1683db);
        local_208 = pfVar2;
        local_250 = Mat::row(local_18,local_1fc);
        for (local_254 = 0; local_254 < local_f4; local_254 = local_254 + 1) {
          local_258 = local_1c;
          for (local_25c = 0; local_25c < local_f0; local_25c = local_25c + 1) {
            local_258 = reduction_op_max<float>::operator()
                                  ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                   (float *)in_stack_fffffffffffff9b8,(float *)0x16847f);
          }
          local_250[local_254] = local_258;
          local_208 = local_208 + local_f0;
        }
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::Mat(in_stack_fffffffffffff9d0,(int)in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8,
               (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),(size_t)in_stack_fffffffffffff9b8,
               (Allocator *)0x16859e);
      bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
        for (local_2a4 = 0; local_2a4 < local_f8; local_2a4 = local_2a4 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_2f0);
          Mat::~Mat((Mat *)0x168640);
          local_2b0 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_338);
          Mat::~Mat((Mat *)0x16868a);
          local_2f8 = pfVar2;
          for (local_33c = 0; local_33c < local_f4; local_33c = local_33c + 1) {
            local_340 = local_1c;
            for (local_344 = 0; local_344 < local_f0; local_344 = local_344 + 1) {
              local_340 = reduction_op_max<float>::operator()
                                    ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                     (float *)in_stack_fffffffffffff9b8,(float *)0x16870c);
            }
            local_2f8[local_33c] = local_340;
            local_2b0 = local_2b0 + local_f0;
          }
        }
        Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
        for (local_348 = 0; local_348 < local_f8; local_348 = local_348 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_390);
          Mat::~Mat((Mat *)0x16883b);
          local_350 = pfVar2;
          for (local_394 = 0; local_394 < local_f4; local_394 = local_394 + 1) {
            Mat::operator[](local_18,(long)local_394);
            fVar3 = reduction_op_max<float>::operator()
                              ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                               (float *)in_stack_fffffffffffff9b8,(float *)0x16889c);
            pfVar2 = Mat::operator[](local_18,(long)local_394);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x168914);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::Mat(in_stack_fffffffffffff9d0,(int)in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8,
               (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),(size_t)in_stack_fffffffffffff9b8,
               (Allocator *)0x16899f);
      bVar1 = Mat::empty(in_stack_fffffffffffff9c0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
        for (local_3dc = 0; local_3dc < local_f8; local_3dc = local_3dc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_428);
          Mat::~Mat((Mat *)0x168a41);
          local_3e8 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_470);
          Mat::~Mat((Mat *)0x168a8b);
          local_430 = pfVar2;
          for (local_474 = 0; local_474 < local_f4; local_474 = local_474 + 1) {
            for (local_478 = 0; local_478 < local_f0; local_478 = local_478 + 1) {
              fVar3 = reduction_op_max<float>::operator()
                                ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                                 (float *)in_stack_fffffffffffff9b8,(float *)0x168b03);
              local_430[local_478] = fVar3;
            }
            local_3e8 = local_3e8 + local_f0;
          }
        }
        Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
        for (local_47c = 0; local_47c < local_f8; local_47c = local_47c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_4c8);
          Mat::~Mat((Mat *)0x168c20);
          local_488 = pfVar2;
          for (local_4cc = 0; local_4cc < local_f0; local_4cc = local_4cc + 1) {
            Mat::operator[](local_18,(long)local_4cc);
            fVar3 = reduction_op_max<float>::operator()
                              ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                               (float *)in_stack_fffffffffffff9b8,(float *)0x168c81);
            pfVar2 = Mat::operator[](local_18,(long)local_4cc);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x168cf9);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
      for (local_4d0 = 0; local_4d0 < local_f8; local_4d0 = local_4d0 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_518);
        Mat::~Mat((Mat *)0x168dc7);
        local_4d8 = pfVar2;
        for (local_51c = 0; local_51c < local_fc; local_51c = local_51c + 1) {
          Mat::operator[](local_18,(long)local_51c);
          in_stack_fffffffffffff9cc =
               reduction_op_max<float>::operator()
                         ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                          (float *)in_stack_fffffffffffff9b8,(float *)0x168e2b);
          pfVar2 = Mat::operator[](local_18,(long)local_51c);
          *pfVar2 = in_stack_fffffffffffff9cc;
        }
      }
      return 0;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8,
                  (size_t)in_stack_fffffffffffff9d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      Mat::fill(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
      for (local_520 = 0; local_520 < local_f8; local_520 = local_520 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
        in_stack_fffffffffffff9c0 = (Mat *)Mat::operator_cast_to_float_(&local_568);
        Mat::~Mat((Mat *)0x168f57);
        local_528 = in_stack_fffffffffffff9c0;
        pfVar2 = Mat::row(local_18,local_520);
        for (local_574 = 0; local_574 < local_f4; local_574 = local_574 + 1) {
          for (local_578 = 0; local_578 < local_f0; local_578 = local_578 + 1) {
            fVar3 = reduction_op_max<float>::operator()
                              ((reduction_op_max<float> *)in_stack_fffffffffffff9c0,
                               (float *)in_stack_fffffffffffff9b8,(float *)0x168ff5);
            pfVar2[local_578] = fVar3;
          }
          local_528 = (Mat *)((long)&local_528->data + (long)local_f0 * 4);
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;
        
        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);
            
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}